

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O2

void erode_obj(obj *target,boolean acid_dmg,boolean fade_scrolls)

{
  boolean bVar1;
  byte bVar2;
  char *pcVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  monst *worm;
  bool bVar10;
  
  if (target == (obj *)0x0) {
    return;
  }
  bVar10 = true;
  if (target->where == '\x03') {
    worm = &youmonst;
    goto LAB_00273044;
  }
  if (target->where == '\x04') {
    worm = (target->v).v_ocarry;
    if (worm == &youmonst || worm == (monst *)0x0) {
      if (worm != (monst *)0x0) goto LAB_00273044;
      goto LAB_0027301b;
    }
    if (worm->wormno == '\0') {
      if ((viz_array[worm->my][worm->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002731c2;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002731b9;
        }
        else {
LAB_002731b9:
          if (ublindf == (obj *)0x0) goto LAB_00273044;
LAB_002731c2:
          if (ublindf->oartifact != '\x1d') goto LAB_00273044;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[worm->my][worm->mx] & 1U) == 0)) || ((worm->data->mflags3 & 0x200) == 0))
        goto LAB_00273044;
      }
    }
    else {
      bVar1 = worm_known(level,worm);
      if (bVar1 == '\0') goto LAB_00273044;
    }
    uVar9 = *(uint *)&worm->field_0x60;
    if ((((uVar9 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if ((-1 < (char)uVar9) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) goto LAB_00273507;
      goto LAB_00273044;
    }
    if ((char)uVar9 < '\0') goto LAB_00273044;
LAB_00273507:
    bVar2 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar9 >> 9) & 1;
  }
  else {
LAB_0027301b:
    bVar10 = (viz_array[bhitpos.y][bhitpos.x] & 2U) == 0;
    worm = (monst *)0x0;
LAB_00273044:
    bVar2 = 1;
  }
  uVar9 = *(uint *)&target->field_0x4a;
  if ((uVar9 >> 0x14 & 1) != 0) {
    grease_protect(target,(char *)0x0,worm);
    return;
  }
  if (target->oclass != '\t') {
    if ((uVar9 >> 0xc & 1) != 0) {
LAB_002731e2:
      if (((~uVar9 & 0x1080) != 0) || (flags.verbose != '\0')) {
        if (worm == &youmonst) {
          pcVar3 = aobjnam(target,"are");
          pline("Your %s not affected.",pcVar3);
        }
        else if (bVar2 == 0) {
          pcVar3 = Monnam(worm);
          pcVar8 = aobjnam(target,"are");
          pline("%s\'s %s not affected.",pcVar3,pcVar8);
        }
      }
      if ((*(uint *)&target->field_0x4a >> 0xc & 1) == 0) {
        return;
      }
      *(uint *)&target->field_0x4a = *(uint *)&target->field_0x4a | 0x80;
      return;
    }
    if (acid_dmg == '\0') {
      if ((*(ushort *)&objects[target->otyp].field_0x11 & 0x1f0) != 0xb0) goto LAB_002731e2;
    }
    else {
      uVar4 = *(ushort *)&objects[target->otyp].field_0x11 >> 4 & 0x1f;
      if ((uVar4 != 0xb) && (uVar4 != 0xd)) goto LAB_002731e2;
    }
    uVar9 = uVar9 >> ((acid_dmg != '\0') * '\x02' | 8U) & 3;
    if (uVar9 != 3) {
      if (worm == &youmonst) {
        pcVar3 = "corrode";
        if (acid_dmg == '\0') {
          pcVar3 = "rust";
        }
        pcVar3 = aobjnam(target,pcVar3);
        pcVar8 = " further";
        if (uVar9 == 0) {
          pcVar8 = "";
        }
        pcVar7 = " completely";
        if (uVar9 != 2) {
          pcVar7 = pcVar8;
        }
        pcVar8 = "Your %s%s!";
      }
      else {
        if (bVar2 == 0) {
          pcVar3 = Monnam(worm);
          pcVar8 = "corrode";
          if (acid_dmg == '\0') {
            pcVar8 = "rust";
          }
          pcVar8 = aobjnam(target,pcVar8);
          pcVar7 = " further";
          if (uVar9 == 0) {
            pcVar7 = "";
          }
          pcVar6 = " completely";
          if (uVar9 != 2) {
            pcVar6 = pcVar7;
          }
          pline("%s\'s %s%s!",pcVar3,pcVar8,pcVar6);
          goto LAB_00273421;
        }
        if (bVar10) goto LAB_00273421;
        pcVar3 = "corrode";
        if (acid_dmg == '\0') {
          pcVar3 = "rust";
        }
        pcVar3 = aobjnam(target,pcVar3);
        pcVar8 = " further";
        if (uVar9 == 0) {
          pcVar8 = "";
        }
        pcVar7 = " completely";
        if (uVar9 != 2) {
          pcVar7 = pcVar8;
        }
        pcVar8 = "The %s%s!";
      }
      pline(pcVar8,pcVar3,pcVar7);
LAB_00273421:
      uVar9 = *(uint *)&target->field_0x4a;
      if (acid_dmg == '\0') {
        uVar5 = uVar9 + 0x100 & 0x300;
        uVar9 = uVar9 & 0xfffffcff;
      }
      else {
        uVar5 = uVar9 + 0x400 & 0xc00;
        uVar9 = uVar9 & 0xfffff3ff;
      }
      *(uint *)&target->field_0x4a = uVar9 | uVar5;
      return;
    }
    if (flags.verbose == '\0') {
      return;
    }
    if (worm != &youmonst) {
      if (bVar2 == 0) {
        pcVar3 = Monnam(worm);
        pcVar8 = aobjnam(target,"look");
        pcVar7 = "corroded";
        if (acid_dmg == '\0') {
          pcVar7 = "rusty";
        }
        pline("%s\'s %s completely %s.",pcVar3,pcVar8,pcVar7);
        return;
      }
      if (bVar10) {
        return;
      }
      pcVar3 = aobjnam(target,"look");
      pcVar8 = "corroded";
      if (acid_dmg == '\0') {
        pcVar8 = "rusty";
      }
      pcVar7 = "The %s completely %s.";
      goto LAB_0027364b;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00273589;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00273580;
      pcVar3 = "look";
    }
    else {
LAB_00273580:
      if (ublindf == (obj *)0x0) {
        pcVar3 = "feel";
      }
      else {
LAB_00273589:
        pcVar3 = "feel";
        if (ublindf->oartifact == '\x1d') {
          pcVar3 = "look";
        }
      }
    }
    pcVar3 = aobjnam(target,pcVar3);
    pcVar8 = "corroded";
    if (acid_dmg == '\0') {
      pcVar8 = "rusty";
    }
    pcVar7 = "Your %s completely %s.";
LAB_0027364b:
    pline(pcVar7,pcVar3,pcVar8);
    return;
  }
  if (fade_scrolls == '\0') {
    return;
  }
  if (target->otyp == 0x17c) {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002730a2;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00273099;
  }
  else {
LAB_00273099:
    if (ublindf == (obj *)0x0) goto LAB_0027354d;
LAB_002730a2:
    if (ublindf->oartifact != '\x1d') goto LAB_0027354d;
  }
  if (worm == &youmonst) {
    pcVar3 = aobjnam(target,"fade");
    pcVar8 = "Your %s.";
  }
  else {
    if (bVar2 == 0) {
      pcVar3 = Monnam(worm);
      pcVar8 = aobjnam(target,"fade");
      pline("%s\'s %s.",pcVar3,pcVar8);
      goto LAB_0027354d;
    }
    if (bVar10) goto LAB_0027354d;
    pcVar3 = aobjnam(target,"fade");
    pcVar8 = "The %s.";
  }
  pline(pcVar8,pcVar3);
LAB_0027354d:
  target->otyp = 0x17c;
  target->spe = '\0';
  return;
}

Assistant:

void erode_obj(struct obj *target, /* object (e.g. weapon or armor) to erode */
	       boolean acid_dmg,
	       boolean fade_scrolls)
{
	int erosion;
	struct monst *victim;
	boolean vismon;
	boolean visobj;

	if (!target)
	    return;
	victim = carried(target) ? &youmonst :
	    mcarried(target) ? target->ocarry : NULL;
	vismon = victim && (victim != &youmonst) && canseemon(level, victim);
	visobj = !victim && cansee(bhitpos.x, bhitpos.y); /* assume thrown */

	erosion = acid_dmg ? target->oeroded2 : target->oeroded;

	if (target->greased) {
	    grease_protect(target,NULL,victim);
	} else if (target->oclass == SCROLL_CLASS) {
	    if (fade_scrolls && target->otyp != SCR_BLANK_PAPER)
	    {
		if (!Blind) {
		    if (victim == &youmonst)
			pline("Your %s.", aobjnam(target, "fade"));
		    else if (vismon)
			pline("%s's %s.", Monnam(victim),
			      aobjnam(target, "fade"));
		    else if (visobj)
			pline("The %s.", aobjnam(target, "fade"));
		}
		target->otyp = SCR_BLANK_PAPER;
		target->spe = 0;
	    }
	} else if (target->oerodeproof ||
		(acid_dmg ? !is_corrodeable(target) : !is_rustprone(target))) {
	    if (flags.verbose || !(target->oerodeproof && target->rknown)) {
		if (victim == &youmonst)
		    pline("Your %s not affected.", aobjnam(target, "are"));
		else if (vismon)
		    pline("%s's %s not affected.", Monnam(victim),
			aobjnam(target, "are"));
		/* no message if not carried */
	    }
	    if (target->oerodeproof) target->rknown = TRUE;
	} else if (erosion < MAX_ERODE) {
	    if (victim == &youmonst)
		pline("Your %s%s!", aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (vismon)
		pline("%s's %s%s!", Monnam(victim),
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (visobj)
		pline("The %s%s!",
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    if (acid_dmg)
		target->oeroded2++;
	    else
		target->oeroded++;
	} else {
	    if (flags.verbose) {
		if (victim == &youmonst)
		    pline("Your %s completely %s.",
			aobjnam(target, Blind ? "feel" : "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (vismon)
		    pline("%s's %s completely %s.", Monnam(victim),
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (visobj)
		    pline("The %s completely %s.",
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
	    }
	}
}